

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ulong uVar1;
  FloatProxy<float> FVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  ushort uVar12;
  uint uVar13;
  short sVar14;
  uint uVar15;
  byte bVar16;
  uint uVar17;
  ushort uVar18;
  short sVar19;
  bool bVar20;
  float float_val;
  uint local_4c;
  FloatProxy<float> local_40;
  int local_3c;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *local_38;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar4 = std::istream::peek();
      iVar4 = isspace(iVar4);
      if (iVar4 == 0) break;
      std::istream::get();
    }
  }
  iVar4 = std::istream::peek();
  if ((iVar4 == 0x2d) || (iVar4 == 0x30)) {
    iVar5 = iVar4;
    if (iVar4 == 0x2d) {
      std::istream::get();
      iVar5 = std::istream::peek();
    }
    if (iVar5 == 0x30) {
      std::istream::get();
      uVar6 = std::istream::peek();
      if ((uVar6 & 0xffffffdf) == 0x58) {
        std::istream::get();
        uVar6 = std::istream::peek();
        local_38 = value;
        local_3c = iVar4;
        while (uVar6 == 0x30) {
          std::istream::get();
          uVar6 = std::istream::peek();
        }
        uVar15 = 0xf;
        bVar20 = false;
        local_4c = 0;
        bVar3 = 0;
        bVar16 = 0;
        uVar18 = 0;
        do {
          if (uVar6 == 0x2e) {
            bVar11 = true;
          }
          else if (uVar6 == 0x70) {
            bVar20 = true;
            bVar11 = false;
          }
          else {
            iVar4 = isxdigit(uVar6);
            if (iVar4 == 0) goto LAB_002870bb;
            pvVar8 = memchr("0123456789",uVar6,0xb);
            if (pvVar8 == (void *)0x0) {
              cVar10 = -0x6f;
              pvVar8 = memchr("abcdef",uVar6,7);
              if (pvVar8 == (void *)0x0) {
                cVar10 = -0x68;
                pvVar8 = memchr("ABCDEF",uVar6,7);
                if (pvVar8 == (void *)0x0) goto LAB_0028733f;
              }
              bVar3 = ((char)pvVar8 - cVar10) + 10;
            }
            else {
              bVar3 = (char)pvVar8 + 0x13;
            }
            uVar7 = (ulong)bVar3;
            iVar4 = 4;
            do {
              uVar1 = (uVar7 & 0xffff) >> 3;
              if ((bVar16 & 1) != 0) {
                if ((uVar15 & 0xffff) == 0x7fff) goto LAB_002870bb;
                uVar6 = (uint)uVar1 & 1;
                uVar12 = uVar18 + 1;
                if (uVar12 == 0) {
                  uVar12 = 0xffff;
                }
                uVar17 = uVar6 << (0xfU - (char)uVar18 & 0x1f);
                if ((short)uVar6 == 0) {
                  uVar17 = 0;
                }
                if (0xf < uVar18) {
                  uVar17 = 0;
                }
                local_4c = local_4c | uVar17;
                uVar15 = uVar15 + 1;
                uVar18 = uVar12;
              }
              bVar16 = bVar16 | (byte)uVar1;
              uVar7 = (ulong)(uint)((int)uVar7 * 2);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            bVar11 = false;
            bVar3 = 1;
          }
          std::istream::get();
          uVar6 = std::istream::peek();
        } while ((!bVar11) && (!bVar20));
        if (bVar11 == true && !bVar20) {
          uVar17 = 0;
          do {
            bVar11 = true;
            if (uVar6 != 0x70) {
              iVar4 = isxdigit(uVar6);
              if (iVar4 == 0) goto LAB_002870bb;
              pvVar8 = memchr("0123456789",uVar6,0xb);
              if (pvVar8 == (void *)0x0) {
                cVar10 = -0x6f;
                pvVar8 = memchr("abcdef",uVar6,7);
                if (pvVar8 == (void *)0x0) {
                  cVar10 = -0x68;
                  pvVar8 = memchr("ABCDEF",uVar6,7);
                  if (pvVar8 == (void *)0x0) {
LAB_0028733f:
                    __assert_fail("false && \"This was called with a non-hex character\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                                  ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
                  }
                }
                bVar16 = ((char)pvVar8 - cVar10) + 10;
              }
              else {
                bVar16 = (char)pvVar8 + 0x13;
              }
              uVar6 = (uint)bVar16;
              iVar4 = 4;
              do {
                uVar9 = uVar6 >> 3 & 1;
                uVar17 = uVar17 | uVar9;
                if ((bVar3 == 0) && ((short)uVar17 == 0)) {
                  uVar15 = uVar15 - 1;
                }
                else {
                  uVar13 = uVar9 << (0xfU - (char)uVar18 & 0x1f);
                  if ((short)uVar9 == 0) {
                    uVar13 = 0;
                  }
                  if (0xf < uVar18) {
                    uVar13 = 0;
                  }
                  local_4c = local_4c | uVar13;
                  uVar18 = uVar18 + 1;
                  if (uVar18 == 0) {
                    uVar18 = 0xffff;
                  }
                }
                uVar6 = uVar6 * 2;
                iVar4 = iVar4 + -1;
                bVar11 = bVar20;
              } while (iVar4 != 0);
            }
            bVar20 = bVar11;
            std::istream::get();
            uVar6 = std::istream::peek();
          } while (!bVar20);
        }
        bVar16 = 1;
        bVar20 = false;
        bVar11 = false;
        iVar4 = 0;
        do {
          sVar19 = (short)iVar4;
          if (bVar11) {
            if (9 < uVar6 - 0x30) {
              sVar19 = sVar19 * (char)bVar16;
              iVar4 = (int)sVar19;
              sVar14 = (short)uVar15;
              if ((sVar19 < 0) || (sVar14 < 0)) {
                if ((sVar19 < 0) && (sVar14 < 0)) {
                  iVar5 = sVar14 + 0x7ffe;
                  uVar6 = 0x8002;
                  if (iVar5 != -iVar4 && SBORROW4(iVar5,-iVar4) == iVar5 + iVar4 < 0) {
                    uVar6 = uVar15 + iVar4;
                  }
                }
                else {
                  uVar6 = iVar4 + uVar15;
                }
              }
              else {
                uVar6 = uVar15 + iVar4;
                if (0x7ffe - sVar14 <= iVar4) {
                  uVar6 = 0x7ffe;
                }
              }
              bVar20 = (short)local_4c == 0;
              local_4c = local_4c << ~(bVar3 | bVar20);
              uVar15 = local_4c >> 1 | 0xffff8000;
              uVar17 = uVar6;
              if ((bool)(~bVar3 & bVar20)) {
                uVar15 = local_4c;
                uVar17 = 0;
              }
              if (bVar3 == 0 && !bVar20) {
                uVar17 = uVar6 - 1;
              }
              if (0 < (short)uVar17) {
                uVar15 = local_4c;
              }
              uVar7 = ((ulong)uVar15 & 0xffff) >> 6;
              uVar18 = (ushort)uVar7;
              if (((short)uVar17 < 0) && (!(bool)(~bVar3 & bVar20))) {
                uVar6 = uVar17;
                do {
                  uVar6 = uVar6 + 1;
                  uVar12 = (ushort)uVar7;
                  uVar7 = uVar7 >> 1;
                  uVar18 = (ushort)uVar7;
                  uVar17 = uVar6;
                  if (uVar12 < 2) {
                    uVar17 = 0;
                  }
                } while (((short)uVar17 < 0) && (1 < uVar12));
              }
              uVar6 = 0x1f;
              if ((short)uVar17 < 0x1f) {
                uVar6 = uVar17;
              }
              if (0x1f < (short)uVar17) {
                uVar18 = 0;
              }
              (local_38->value_).data_ =
                   (ushort)((uVar6 & 0x1f) << 10) | (ushort)(local_3c == 0x2d) << 0xf | uVar18;
              return is;
            }
LAB_00286f55:
            iVar4 = iVar4 * 10 + (uVar6 & 0xf);
            if ((short)(ushort)((0x7ffe - (uVar6 & 0xf)) * 0x6667 >> 0x12) <= sVar19) {
              iVar4 = 0x7ffe;
            }
            bVar11 = true;
          }
          else {
            if ((uVar6 != 0x2d) && (uVar6 != 0x2b)) {
              if (uVar6 - 0x30 < 10) goto LAB_00286f55;
              goto LAB_002870bb;
            }
            if (bVar20) goto LAB_002870bb;
            bVar16 = -(uVar6 == 0x2d) | 1;
            bVar20 = true;
            bVar11 = false;
          }
          std::istream::get();
          uVar6 = std::istream::peek();
        } while( true );
      }
      std::istream::unget();
      local_40.data_ = 0;
      ParseNormalFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                (is,iVar4 == 0x2d,
                 (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                  *)&local_40);
    }
    else {
      local_40.data_ = 0;
      ParseNormalFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                (is,iVar4 == 0x2d,
                 (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                  *)&local_40);
    }
  }
  else {
    local_40.data_ = 0;
    std::istream::_M_extract<float>((float *)is);
    FVar2.data_ = local_40.data_;
    if ((local_40.data_ & 0x7fffffff) == 0 &&
        (*(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20) & 5) != 0) {
      local_40.data_ = 0;
    }
    if ((FVar2.data_ & 0x7fffffff) == 0x7f800000) {
      local_40.data_ = local_40.data_ & 0x80000000 | 0x7f7fffff;
      std::ios::clear((int)*(long *)(*(long *)is + -0x18) + (int)is);
    }
  }
  HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
  ::
  castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
            ((HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
              *)&local_40,value,kToZero);
  uVar18 = (value->value_).data_;
  if ((uVar18 & 0x7fff) == 0x7c00) {
    (value->value_).data_ = uVar18 & 0x8000 | 0x7bff;
LAB_002870bb:
    std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}